

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::StringTree::concat<kj::CappedArray<char,5ul>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,CappedArray<char,_5UL> *params,
          ArrayPtr<const_char> *params_1)

{
  size_t sVar1;
  Branch *pBVar2;
  size_t size;
  String local_48;
  
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->text).content.size_ = 0;
  size = *(long *)params->content + this->size_;
  __return_storage_ptr__->size_ = size;
  heapString(&local_48,size);
  (__return_storage_ptr__->text).content.ptr = local_48.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_48.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_48.content.disposer;
  pBVar2 = (Branch *)
           _::HeapArrayDisposer::allocateImpl
                     (0x40,0,0,_::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                      ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  sVar1 = this->size_;
  (__return_storage_ptr__->branches).ptr = pBVar2;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  if (local_48.content.size_ == 0) {
    local_48.content.ptr = (char *)0x0;
  }
  if (sVar1 != 0) {
    memcpy(local_48.content.ptr,&this->text,sVar1);
    local_48.content.ptr = local_48.content.ptr + sVar1;
  }
  sVar1._0_1_ = params->content[0];
  sVar1._1_1_ = params->content[1];
  sVar1._2_1_ = params->content[2];
  sVar1._3_1_ = params->content[3];
  sVar1._4_1_ = params->content[4];
  sVar1._5_3_ = *(undefined3 *)&params->field_0xd;
  if (sVar1 != 0) {
    memcpy(local_48.content.ptr,(void *)params->currentSize,sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}